

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_svc_set_last_source
               (AV1_COMP *cpi,EncodeFrameInput *frame_input,YV12_BUFFER_CONFIG *prev_source)

{
  YV12_BUFFER_CONFIG *local_40;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int buffslot_last;
  RTC_REF *rtc_ref;
  YV12_BUFFER_CONFIG *prev_source_local;
  EncodeFrameInput *frame_input_local;
  AV1_COMP *cpi_local;
  
  local_40 = prev_source;
  if (prev_source == (YV12_BUFFER_CONFIG *)0x0) {
    local_40 = (YV12_BUFFER_CONFIG *)0x0;
  }
  frame_input->last_source = local_40;
  if (((cpi->ppi->use_svc == 0) && ((cpi->rc).prev_frame_is_dropped != 0)) &&
     ((cpi->rc).frame_number_encoded != 0)) {
    frame_input->last_source = &(cpi->svc).source_last_TL0;
  }
  else if ((cpi->svc).spatial_layer_id == 0) {
    if (((cpi->svc).current_superframe != 0) &&
       (((((cpi->svc).layer_context)->rc).prev_frame_is_dropped != 0 ||
        ((cpi->ppi->rtc_ref).buffer_time_index[(cpi->ppi->rtc_ref).ref_idx[0]] <
         (cpi->svc).current_superframe - 1)))) {
      frame_input->last_source = &(cpi->svc).source_last_TL0;
    }
  }
  else if (0 < (cpi->svc).spatial_layer_id) {
    if ((cpi->svc).current_superframe == 0) {
      frame_input->last_source = (YV12_BUFFER_CONFIG *)0x0;
    }
    else {
      frame_input->last_source = &(cpi->svc).source_last_TL0;
    }
  }
  return;
}

Assistant:

void av1_svc_set_last_source(AV1_COMP *const cpi, EncodeFrameInput *frame_input,
                             YV12_BUFFER_CONFIG *prev_source) {
  frame_input->last_source = prev_source != NULL ? prev_source : NULL;
  if (!cpi->ppi->use_svc && cpi->rc.prev_frame_is_dropped &&
      cpi->rc.frame_number_encoded > 0) {
    frame_input->last_source = &cpi->svc.source_last_TL0;
  } else {
    RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
    if (cpi->svc.spatial_layer_id == 0) {
      // For base spatial layer: if the LAST reference (index 0) is not
      // the previous (super)frame set the last_source to the source
      // corresponding to the last TL0, otherwise keep it at prev_source.
      // Always use source_last_TL0 if previous base TL0 was dropped.
      if (cpi->svc.current_superframe > 0) {
        const int buffslot_last = rtc_ref->ref_idx[0];
        // Check if previous frame was dropped on base TL0 layer.
        const int layer =
            LAYER_IDS_TO_IDX(0, 0, cpi->svc.number_temporal_layers);
        LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
        RATE_CONTROL *lrc = &lc->rc;
        if (lrc->prev_frame_is_dropped ||
            rtc_ref->buffer_time_index[buffslot_last] <
                cpi->svc.current_superframe - 1) {
          frame_input->last_source = &cpi->svc.source_last_TL0;
        }
      }
    } else if (cpi->svc.spatial_layer_id > 0) {
      // For spatial enhancement layers: the previous source (prev_source)
      // corresponds to the lower spatial layer (which is the same source so
      // we can't use that), so always set the last_source to the source of the
      // last TL0.
      if (cpi->svc.current_superframe > 0)
        frame_input->last_source = &cpi->svc.source_last_TL0;
      else
        frame_input->last_source = NULL;
    }
  }
}